

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O3

Aig_Man_t *
introduceAbsorberLogic(Aig_Man_t *pAig,int *pLiveIndex_0,int *pLiveIndex_k,int nonFirstIteration)

{
  void *pvVar1;
  uint uVar2;
  Aig_Man_t *p;
  size_t sVar3;
  char *__s;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  Aig_Obj_t *p1;
  int iVar9;
  long lVar10;
  Aig_Obj_t *pAVar11;
  int iVar12;
  Aig_Obj_t *local_48;
  Aig_Obj_t *local_40;
  
  if (*pLiveIndex_0 == -1) {
    __assert_fail("*pLiveIndex_0 != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/kliveness.c"
                  ,0xb9,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  if (nonFirstIteration == 0) {
    if (*pLiveIndex_k != -1) {
      __assert_fail("*pLiveIndex_k == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/kliveness.c"
                    ,0xbb,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
  }
  else if (*pLiveIndex_k == -1) {
    __assert_fail("*pLiveIndex_k != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/kliveness.c"
                  ,0xbd,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar3 = strlen(pAig->pName);
  __s = (char *)malloc(sVar3 + 5);
  p->pName = __s;
  sprintf(__s,"%s_%s",pAig->pName,"kCS");
  p->pSpec = (char *)0x0;
  pAVar4 = readLiveSignal_0(pAig,*pLiveIndex_0);
  if (*pLiveIndex_k == -1) {
    local_48 = (Aig_Obj_t *)0x0;
  }
  else {
    local_48 = readLiveSignal_k(pAig,*pLiveIndex_k);
  }
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nTruePis) {
    lVar10 = 0;
    do {
      if (pAig->vCis->nSize <= lVar10) goto LAB_00634a27;
      pvVar1 = pAig->vCis->pArray[lVar10];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar10 = lVar10 + 1;
    } while (lVar10 < pAig->nTruePis);
  }
  if (pAig->nRegs < 1) {
    iVar12 = 1;
  }
  else {
    iVar9 = 0;
    do {
      iVar12 = iVar9;
      uVar2 = pAig->nTruePis + iVar12;
      if (((int)uVar2 < 0) || (pAig->vCis->nSize <= (int)uVar2)) goto LAB_00634a27;
      pvVar1 = pAig->vCis->pArray[uVar2];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      iVar9 = iVar12 + 1;
    } while (iVar12 + 1 < pAig->nRegs);
    iVar12 = iVar12 + 2;
  }
  pAVar5 = Aig_ObjCreateCi(p);
  pVVar7 = pAig->vObjs;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar7->pArray[lVar10];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_00634a46;
        uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar11 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar11 = Aig_And(p,pAVar11,p1);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar11;
        pVVar7 = pAig->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar7->nSize);
  }
  if (nonFirstIteration == 0) {
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      __assert_fail("pPIn",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/kliveness.c"
                    ,0x100,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
    if (((ulong)pAVar4 & 1) == 0) {
      pAVar4 = (Aig_Obj_t *)(pAVar4->field_5).pData;
    }
    else {
      pAVar4 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x28) ^ 1);
    }
    local_40 = Aig_Or(p,(Aig_Obj_t *)((ulong)pAVar4 ^ 1),pAVar5);
    local_48 = Aig_Or(p,pAVar4,(Aig_Obj_t *)((ulong)pAVar5 ^ 1));
    if (0 < pAig->nTruePos) goto LAB_006348aa;
    uVar6 = 0;
  }
  else {
    if (local_48 == (Aig_Obj_t *)0x0) {
      __assert_fail("pPOut",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/kliveness.c"
                    ,0x10b,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
    if (((ulong)pAVar4 & 1) == 0) {
      pAVar4 = (Aig_Obj_t *)(pAVar4->field_5).pData;
    }
    else {
      pAVar4 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x28) ^ 1);
    }
    if (((ulong)local_48 & 1) == 0) {
      pAVar11 = (Aig_Obj_t *)((ulong)(local_48->field_5).pData ^ 1);
    }
    else {
      pAVar11 = *(Aig_Obj_t **)(((ulong)local_48 & 0xfffffffffffffffe) + 0x28);
    }
    local_40 = Aig_Or(p,pAVar11,pAVar5);
    local_48 = Aig_Or(p,pAVar4,(Aig_Obj_t *)((ulong)pAVar5 ^ 1));
    if (pAig->nTruePos < 1) goto LAB_00634a65;
LAB_006348aa:
    uVar6 = 0;
    pAVar4 = (Aig_Obj_t *)0x0;
    do {
      if ((long)pAig->vCos->nSize <= (long)uVar6) goto LAB_00634a27;
      pvVar1 = pAig->vCos->pArray[uVar6];
      if (((ulong)pvVar1 & 1) != 0) goto LAB_00634a46;
      uVar8 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      pAVar5 = Aig_ObjCreateCo(p,pAVar5);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      if (uVar6 == (uint)*pLiveIndex_k) {
        pAVar4 = pAVar5;
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)pAig->nTruePos);
    if (nonFirstIteration != 0) {
      if (pAVar4 == (Aig_Obj_t *)0x0) {
LAB_00634a65:
        __assert_fail("pPOutCo != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/kliveness.c"
                      ,300,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
      }
      Aig_ObjPatchFanin0(p,pAVar4,local_48);
      goto LAB_0063497f;
    }
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      __assert_fail("pPOutCo == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/kliveness.c"
                    ,0x125,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
  }
  Aig_ObjCreateCo(p,local_48);
  *pLiveIndex_k = (int)uVar6;
LAB_0063497f:
  if (0 < pAig->nRegs) {
    iVar9 = 0;
    do {
      uVar2 = pAig->nTruePos + iVar9;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
LAB_00634a27:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar2];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_00634a46:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar6 = *(ulong *)((long)pvVar1 + 8);
      uVar8 = uVar6 & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar4);
      iVar9 = iVar9 + 1;
    } while (iVar9 < pAig->nRegs);
  }
  Aig_ObjCreateCo(p,local_40);
  Aig_ManSetRegNum(p,iVar12);
  Aig_ManCleanup(p);
  iVar12 = Aig_ManCheck(p);
  if (iVar12 == 0) {
    __assert_fail("Aig_ManCheck( pNewAig )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/kliveness.c"
                  ,0x140,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  if (*pLiveIndex_k == -1) {
    __assert_fail("*pLiveIndex_k != - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/kliveness.c"
                  ,0x142,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  return p;
}

Assistant:

Aig_Man_t *introduceAbsorberLogic( Aig_Man_t *pAig, int *pLiveIndex_0, int *pLiveIndex_k, int nonFirstIteration )
{
    Aig_Man_t *pNewAig;
    Aig_Obj_t *pObj, *pObjAbsorberLo, *pPInNewArg, *pPOutNewArg;
    Aig_Obj_t *pPIn = NULL, *pPOut = NULL, *pPOutCo = NULL;
    Aig_Obj_t *pFirstAbsorberOr, *pSecondAbsorberOr;
    int i;
    int piCopied = 0, loCreated = 0, loCopied = 0, liCreated = 0, liCopied = 0; 
    int nRegCount;

    assert(*pLiveIndex_0 != -1);
    if(nonFirstIteration == 0)
        assert( *pLiveIndex_k == -1 );
    else
        assert( *pLiveIndex_k != -1  );

    //****************************************************************
    // Step1: create the new manager
    // Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
    // nodes, but this selection is arbitrary - need to be justified
    //****************************************************************
    pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
    pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_kCS") + 1 );
    sprintf(pNewAig->pName, "%s_%s", pAig->pName, "kCS");
        pNewAig->pSpec = NULL;

    //****************************************************************
    // reading the signal pIn, and pOut
    //****************************************************************

    pPIn = readLiveSignal_0( pAig, *pLiveIndex_0 );
    if( *pLiveIndex_k == -1 )
        pPOut = NULL;
    else
        pPOut = readLiveSignal_k( pAig, *pLiveIndex_k );
    
    //****************************************************************
    // Step 2: map constant nodes
    //****************************************************************
        pObj = Aig_ManConst1( pAig );
        pObj->pData = Aig_ManConst1( pNewAig );

    //****************************************************************
        // Step 3: create true PIs
    //****************************************************************
        Saig_ManForEachPi( pAig, pObj, i )
    {
        piCopied++;
        pObj->pData = Aig_ObjCreateCi(pNewAig);
    }

    //****************************************************************
    // Step 5: create register outputs
    //****************************************************************
        Saig_ManForEachLo( pAig, pObj, i )
        {
        loCopied++;
        pObj->pData = Aig_ObjCreateCi(pNewAig);
        }

    //****************************************************************
    // Step 6: create "D" register output for the ABSORBER logic
    //****************************************************************
    loCreated++;
    pObjAbsorberLo = Aig_ObjCreateCi( pNewAig );

    nRegCount = loCreated + loCopied;

    //********************************************************************
    // Step 7: create internal nodes
    //********************************************************************
        Aig_ManForEachNode( pAig, pObj, i )
    {
        pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }

    //****************************************************************
    // Step 8: create the two OR gates of the OBSERVER logic
    //****************************************************************
    if( nonFirstIteration == 0 )
    {
        assert(pPIn);
        
        pPInNewArg = !Aig_IsComplement(pPIn)? 
                (Aig_Obj_t *)((Aig_Regular(pPIn))->pData) : 
                Aig_Not((Aig_Obj_t *)((Aig_Regular(pPIn))->pData));

        pFirstAbsorberOr = Aig_Or( pNewAig, Aig_Not(pPInNewArg), pObjAbsorberLo );
        pSecondAbsorberOr = Aig_Or( pNewAig, pPInNewArg, Aig_Not(pObjAbsorberLo) );
    }
    else
    {
        assert( pPOut );

        pPInNewArg = !Aig_IsComplement(pPIn)? 
                (Aig_Obj_t *)((Aig_Regular(pPIn))->pData) : 
                Aig_Not((Aig_Obj_t *)((Aig_Regular(pPIn))->pData));
        pPOutNewArg = !Aig_IsComplement(pPOut)? 
                (Aig_Obj_t *)((Aig_Regular(pPOut))->pData) : 
                Aig_Not((Aig_Obj_t *)((Aig_Regular(pPOut))->pData));
        
        pFirstAbsorberOr = Aig_Or( pNewAig, Aig_Not(pPOutNewArg), pObjAbsorberLo );
        pSecondAbsorberOr = Aig_Or( pNewAig, pPInNewArg, Aig_Not(pObjAbsorberLo) );
    }    
    
    //********************************************************************
    // Step 9: create primary outputs 
    //********************************************************************
    Saig_ManForEachPo( pAig, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
        if( i == *pLiveIndex_k )
            pPOutCo = (Aig_Obj_t *)(pObj->pData);
    }

    //create new po
    if( nonFirstIteration == 0 )
    {
        assert(pPOutCo == NULL);
        pPOutCo = Aig_ObjCreateCo( pNewAig, pSecondAbsorberOr );     

        *pLiveIndex_k = i;
    }    
    else
    {
        assert( pPOutCo != NULL );
        //pPOutCo = Aig_ObjCreateCo( pNewAig, pSecondAbsorberOr );     
        //*pLiveIndex_k = Saig_ManPoNum(pAig);

        Aig_ObjPatchFanin0( pNewAig, pPOutCo, pSecondAbsorberOr );
    }

    Saig_ManForEachLi( pAig, pObj, i )
    {
        liCopied++;
        Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
    }

    //create new li
    liCreated++;
    Aig_ObjCreateCo( pNewAig, pFirstAbsorberOr );

    Aig_ManSetRegNum( pNewAig, nRegCount );
    Aig_ManCleanup( pNewAig );
    
    assert( Aig_ManCheck( pNewAig ) );

    assert( *pLiveIndex_k != - 1);
    return pNewAig;
}